

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall Assimp::FBX::FBXConverter::ConvertRootNode(FBXConverter *this)

{
  size_type sVar1;
  aiNode *paVar2;
  string unique_name;
  string local_80;
  aiMatrix4x4 local_60;
  
  paVar2 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar2);
  this->out->mRootNode = paVar2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_60._0_8_ = &local_60.b1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"RootNode","");
  GetUniqueName(this,(string *)&local_60,&local_80);
  if ((float *)local_60._0_8_ != &local_60.b1) {
    operator_delete((void *)local_60._0_8_);
  }
  sVar1 = local_80._M_string_length;
  if (local_80._M_string_length < 0x400) {
    paVar2 = this->out->mRootNode;
    (paVar2->mName).length = (ai_uint32)local_80._M_string_length;
    memcpy((paVar2->mName).data,local_80._M_dataplus._M_p,local_80._M_string_length);
    (paVar2->mName).data[sVar1] = '\0';
  }
  local_60.a1 = 1.0;
  local_60.a2 = 0.0;
  local_60.a3 = 0.0;
  local_60.a4 = 0.0;
  local_60.b1 = 0.0;
  local_60.b2 = 1.0;
  local_60.b3 = 0.0;
  local_60.b4 = 0.0;
  local_60.c1 = 0.0;
  local_60.c2 = 0.0;
  local_60.c3 = 1.0;
  local_60.c4 = 0.0;
  local_60.d1 = 0.0;
  local_60.d2 = 0.0;
  local_60.d3 = 0.0;
  local_60.d4 = 1.0;
  ConvertNodes(this,0,this->out->mRootNode,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FBXConverter::ConvertRootNode() {
            out->mRootNode = new aiNode();
            std::string unique_name;
            GetUniqueName("RootNode", unique_name);
            out->mRootNode->mName.Set(unique_name);

            // root has ID 0
            ConvertNodes(0L, *out->mRootNode);
        }